

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

char * Gia_ObjGetDumpName(Vec_Ptr_t *vNames,char c,int i,int d)

{
  int iVar1;
  char *pName_00;
  char *pName;
  int d_local;
  int i_local;
  char c_local;
  Vec_Ptr_t *vNames_local;
  
  if (vNames == (Vec_Ptr_t *)0x0) {
    sprintf(Gia_ObjGetDumpName::pBuffer,"%c%0*d%c",(ulong)(uint)(int)c,(ulong)(uint)d,(ulong)(uint)i
            ,(ulong)(uint)(int)c);
  }
  else {
    pName_00 = (char *)Vec_PtrEntry(vNames,i);
    iVar1 = Gia_ManNameIsLegalInVerilog(pName_00);
    if (iVar1 == 0) {
      sprintf(Gia_ObjGetDumpName::pBuffer,"\\%s ",pName_00);
    }
    else {
      sprintf(Gia_ObjGetDumpName::pBuffer,"%s",pName_00);
    }
  }
  return Gia_ObjGetDumpName::pBuffer;
}

Assistant:

char * Gia_ObjGetDumpName( Vec_Ptr_t * vNames, char c, int i, int d )
{
    static char pBuffer[10000];
    if ( vNames )
    {
        char * pName = (char *)Vec_PtrEntry(vNames, i);
        if ( Gia_ManNameIsLegalInVerilog(pName) )
            sprintf( pBuffer, "%s", pName );
        else
            sprintf( pBuffer, "\\%s ", pName );
    }
    else
        sprintf( pBuffer, "%c%0*d%c", c, d, i, c );
    return pBuffer;
}